

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

bool __thiscall IlmThread_2_5::anon_unknown_5::DefaultWorkData::stopped(DefaultWorkData *this)

{
  bool bVar1;
  atomic<bool> *in_stack_00000008;
  
  bVar1 = std::atomic<bool>::load(in_stack_00000008,this._4_4_);
  return bVar1;
}

Assistant:

inline bool stopped () const
    {
#ifdef ILMBASE_FORCE_CXX03
        Lock lock (stopMutex);
        return stopping;
#else
        return stopping.load( std::memory_order_relaxed );
#endif
    }